

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
sort_function::evaluate
          (sort_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  unsigned_long *puVar4;
  assertion_error *this_01;
  const_reference pvVar5;
  size_t sVar6;
  reference pbVar7;
  vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RSI;
  __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *v;
  size_t i;
  bool is_string;
  bool is_number;
  reference arg0;
  string *in_stack_ffffffffffffff18;
  ulong uVar8;
  __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff28;
  range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  in_stack_ffffffffffffff40;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff50;
  range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  in_stack_ffffffffffffff58;
  ulong local_88;
  size_t in_stack_ffffffffffffffb0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  reference local_8;
  
  this_00 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
            std::
            vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ::size(in_RSI);
  function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::arity
            ((function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)in_RDI._M_current);
  puVar4 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x4da21c);
  if (this_00 != (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)*puVar4) {
    this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff58.last_._M_current._M_current,
               (char *)in_stack_ffffffffffffff58.first_._M_current._M_current,
               (allocator<char> *)in_stack_ffffffffffffff50);
    assertion_error::assertion_error(this_01,in_stack_ffffffffffffff18);
    __cxa_throw(this_01,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  pvVar5 = std::
           vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ::operator[](in_RSI,0);
  bVar1 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
          is_value(pvVar5);
  if (bVar1) {
    pvVar5 = std::
             vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ::operator[](in_RSI,0);
    local_8 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ::value(pvVar5);
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(this_00);
    if (bVar1) {
      sVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                        (in_stack_ffffffffffffff28._M_current);
      if (1 < sVar6) {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                  (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(this_00)
        ;
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                  (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(this_00)
        ;
        if ((bVar1) || (bVar2)) {
          local_88 = 1;
          while (uVar8 = local_88,
                sVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                                  (in_stack_ffffffffffffff28._M_current), uVar8 < sVar6) {
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
            bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                              (this_00);
            if (bVar3 != bVar1) {
LAB_004da4b5:
              std::error_code::operator=
                        ((error_code *)in_RDI._M_current,
                         (jmespath_errc)((ulong)in_stack_ffffffffffffff28._M_current >> 0x20));
              pbVar7 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       ::null_value((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                     *)in_RDI._M_current);
              return pbVar7;
            }
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
            bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                              (this_00);
            if (bVar3 != bVar2) goto LAB_004da4b5;
            local_88 = local_88 + 1;
          }
          local_8 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ::
                    create_json<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                              (in_stack_ffffffffffffff50,
                               in_stack_ffffffffffffff40.last_._M_current._M_current);
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(local_8);
          range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
          ::begin((range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                   *)&stack0xffffffffffffff58);
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(local_8);
          range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
          ::end((range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                 *)&stack0xffffffffffffff40);
          std::
          stable_sort<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
                    (in_RDI,in_stack_ffffffffffffff28);
        }
        else {
          std::error_code::operator=
                    ((error_code *)in_RDI._M_current,
                     (jmespath_errc)((ulong)in_stack_ffffffffffffff28._M_current >> 0x20));
          local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::null_value((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                  *)in_RDI._M_current);
        }
      }
    }
    else {
      std::error_code::operator=
                ((error_code *)in_RDI._M_current,
                 (jmespath_errc)((ulong)in_stack_ffffffffffffff28._M_current >> 0x20));
      local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                ::null_value((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                              *)in_RDI._M_current);
    }
  }
  else {
    std::error_code::operator=
              ((error_code *)in_RDI._M_current,
               (jmespath_errc)((ulong)in_stack_ffffffffffffff28._M_current >> 0x20));
    local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ::null_value((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                            *)in_RDI._M_current);
  }
  return local_8;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                if (arg0.size() <= 1)
                {
                    return arg0;
                }

                bool is_number = arg0.at(0).is_number();
                bool is_string = arg0.at(0).is_string();
                if (!is_number && !is_string)
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                for (std::size_t i = 1; i < arg0.size(); ++i)
                {
                    if (arg0.at(i).is_number() != is_number || arg0.at(i).is_string() != is_string)
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                }

                auto v = context.create_json(arg0);
                std::stable_sort((v->array_range()).begin(), (v->array_range()).end());
                return *v;
            }